

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O0

void __thiscall Assimp::BlobIOStream::Grow(BlobIOStream *this,size_t need)

{
  uint8_t *__src;
  unsigned_long *puVar1;
  uint8_t *puVar2;
  uint8_t *old;
  ulong local_20;
  size_t new_size;
  size_t need_local;
  BlobIOStream *this_local;
  
  old = (uint8_t *)(this->cur_size + (this->cur_size >> 1));
  new_size = need;
  need_local = (size_t)this;
  puVar1 = std::max<unsigned_long>(&new_size,(unsigned_long *)&old);
  puVar1 = std::max<unsigned_long>(&this->initial,puVar1);
  local_20 = *puVar1;
  __src = this->buffer;
  puVar2 = (uint8_t *)operator_new__(local_20);
  this->buffer = puVar2;
  if ((__src != (uint8_t *)0x0) &&
     (memcpy(this->buffer,__src,this->cur_size), __src != (uint8_t *)0x0)) {
    operator_delete__(__src);
  }
  this->cur_size = local_20;
  return;
}

Assistant:

void Grow(size_t need = 0)
    {
        // 1.5 and phi are very heap-friendly growth factors (the first
        // allows for frequent re-use of heap blocks, the second
        // forms a fibonacci sequence with similar characteristics -
        // since this heavily depends on the heap implementation
        // and other factors as well, i'll just go with 1.5 since
        // it is quicker to compute).
        size_t new_size = std::max(initial, std::max( need, cur_size+(cur_size>>1) ));

        const uint8_t* const old = buffer;
        buffer = new uint8_t[new_size];

        if (old) {
            memcpy(buffer,old,cur_size);
            delete[] old;
        }

        cur_size = new_size;
    }